

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.h
# Opt level: O1

Ptr __thiscall hwnet::TCPSocket::SetCloseCallback(TCPSocket *this,CloseCallback *callback)

{
  int iVar1;
  function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr PVar2;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&callback[0x49]._M_invoker);
  if (iVar1 == 0) {
    std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)>::operator=
              ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)> *)
               &callback[0x45]._M_invoker,in_RDX);
    std::__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<hwnet::TCPSocket,void>
              ((__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2> *)this,
               (__weak_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2> *)&callback->_M_invoker);
    pthread_mutex_unlock((pthread_mutex_t *)&callback[0x49]._M_invoker);
    PVar2.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    PVar2.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
    return (Ptr)PVar2.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

TCPSocket::Ptr SetCloseCallback(const CloseCallback &callback){
		std::lock_guard<std::mutex> guard(this->mtx);
	    closeCallback_ = callback;
		return shared_from_this();	    
	}